

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

UnaryFunctionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unary(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0xdc) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xdc;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.unary_ = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::UnaryFunctionLayerParams>(arena);
    (this->layer_).unary_ = (UnaryFunctionLayerParams *)LVar2;
  }
  return (UnaryFunctionLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams* NeuralNetworkLayer::_internal_mutable_unary() {
  if (!_internal_has_unary()) {
    clear_layer();
    set_has_unary();
    layer_.unary_ = CreateMaybeMessage< ::CoreML::Specification::UnaryFunctionLayerParams >(GetArenaForAllocation());
  }
  return layer_.unary_;
}